

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O2

int mk_string_itop(uint64_t value,mk_ptr_t *p)

{
  char cVar1;
  char *pcVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  
  uVar3 = digits10(value);
  pcVar2 = p->data;
  uVar5 = uVar3;
  while( true ) {
    uVar6 = uVar5 - 2;
    uVar5 = uVar5 - 1;
    if (value < 100) break;
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(value % 100) * 2];
    pcVar2[uVar5] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [(value % 100) * 2 + 1];
    pcVar2[uVar6] = cVar1;
    value = value / 100;
    uVar5 = uVar6;
  }
  if (value < 10) {
    bVar7 = (byte)value | 0x30;
    uVar6 = uVar5;
  }
  else {
    pcVar2[uVar5] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [(value * 2 & 0xffffffff) + 1];
    bVar7 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [value * 2 & 0x1fffffffe];
  }
  pcVar2[uVar6] = bVar7;
  pcVar2 = p->data;
  uVar4 = (ulong)uVar3;
  (pcVar2 + uVar4)[0] = '\r';
  (pcVar2 + uVar4)[1] = '\n';
  pcVar2[uVar4 + 2] = '\0';
  p->len = (unsigned_long)(pcVar2 + ~(ulong)p->data + uVar4 + 3);
  return (int)(pcVar2 + ~(ulong)p->data + uVar4 + 3);
}

Assistant:

int mk_string_itop(uint64_t value, mk_ptr_t *p)
{
    static const char digits[201] =
        "0001020304050607080910111213141516171819"
        "2021222324252627282930313233343536373839"
        "4041424344454647484950515253545556575859"
        "6061626364656667686970717273747576777879"
        "8081828384858687888990919293949596979899";

    uint32_t const length = digits10(value);
    uint32_t next = length - 1;
    char *dst = p->data;

    while (value >= 100) {
        int const i = (value % 100) * 2;
        value /= 100;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
        next -= 2;
    }

    /* Handle last 1-2 digits */
    if (value < 10) {
        dst[next] = '0' + (uint32_t) value;
    }
    else {
        int i = (uint32_t) value * 2;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
    }

    dst = p->data + length;
    *dst++ = '\r';
    *dst++ = '\n';
    *dst++ = '\0';

    p->len = (dst - p->data - 1);
    return p->len;
}